

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

StringTree * __thiscall
capnp::anon_unknown_1::CapnpcCppMain::makeGenericDeclarations
          (StringTree *__return_storage_ptr__,CapnpcCppMain *this,TemplateContext *templateContext,
          bool hasBrandDependencies)

{
  char (*in_stack_ffffffffffffff68) [15];
  StringTree local_68;
  char *local_30;
  char local_21;
  TemplateContext *pTStack_20;
  bool hasBrandDependencies_local;
  TemplateContext *templateContext_local;
  CapnpcCppMain *this_local;
  
  local_30 = "";
  if (hasBrandDependencies) {
    local_30 = "    static const ::capnp::_::RawBrandedSchema::Dependency brandDependencies[];\n";
  }
  local_21 = hasBrandDependencies;
  pTStack_20 = templateContext;
  templateContext_local = (TemplateContext *)this;
  this_local = (CapnpcCppMain *)__return_storage_ptr__;
  TemplateContext::allArgs(&local_68,templateContext);
  kj::strTree<char_const(&)[141],char_const*,char_const(&)[175],kj::StringTree,char_const(&)[15]>
            (__return_storage_ptr__,
             (kj *)
             "    static const ::capnp::_::RawBrandedSchema::Scope brandScopes[];\n    static const ::capnp::_::RawBrandedSchema::Binding brandBindings[];\n"
             ,(char (*) [141])&local_30,
             (char **)
             "    static const ::capnp::_::RawBrandedSchema specificBrand;\n    static constexpr ::capnp::_::RawBrandedSchema const* brand() { return ::capnp::_::ChooseBrand<_capnpPrivate, "
             ,(char (*) [175])&local_68,(StringTree *)">::brand(); }\n",in_stack_ffffffffffffff68);
  kj::StringTree::~StringTree(&local_68);
  return __return_storage_ptr__;
}

Assistant:

kj::StringTree makeGenericDeclarations(const TemplateContext& templateContext,
                                         bool hasBrandDependencies) {
    // Returns the declarations for the private members of a generic struct/interface;
    // paired with the definitions from makeGenericDefinitions().
    return kj::strTree(
        "    static const ::capnp::_::RawBrandedSchema::Scope brandScopes[];\n"
        "    static const ::capnp::_::RawBrandedSchema::Binding brandBindings[];\n",
        (!hasBrandDependencies ? "" :
            "    static const ::capnp::_::RawBrandedSchema::Dependency brandDependencies[];\n"),
        "    static const ::capnp::_::RawBrandedSchema specificBrand;\n"
        "    static constexpr ::capnp::_::RawBrandedSchema const* brand() { "
        "return ::capnp::_::ChooseBrand<_capnpPrivate, ", templateContext.allArgs(), ">::brand(); }\n");
  }